

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_ecmult_wnaf(void *arg,int iters)

{
  int iVar1;
  int in_register_00000004;
  uint uVar2;
  ulong unaff_RBX;
  int iVar3;
  void *pvVar4;
  int iVar5;
  void *unaff_R14;
  int *unaff_R15;
  secp256k1_sha256 sStack_c0;
  ulong uStack_50;
  void *pvStack_48;
  code *pcStack_40;
  int local_34;
  
  pvVar4 = arg;
  pvStack_48 = unaff_R14;
  local_34 = in_register_00000004;
  if (0 < iters) {
    unaff_R15 = (int *)((long)arg + 0x2d0);
    iVar5 = 0;
    unaff_RBX = (ulong)(uint)iters;
    iVar3 = 0;
    local_34 = iters;
    do {
      pcStack_40 = (code *)0x122df2;
      iVar1 = secp256k1_ecmult_wnaf(unaff_R15,0x100,(secp256k1_scalar *)arg,5);
      iVar3 = iVar3 + iVar1;
      pcStack_40 = (code *)0x122e02;
      pvVar4 = arg;
      iVar1 = secp256k1_scalar_add
                        ((secp256k1_scalar *)arg,(secp256k1_scalar *)arg,
                         (secp256k1_scalar *)((long)arg + 0x20));
      iVar5 = iVar5 + iVar1;
      uVar2 = (int)unaff_RBX - 1;
      unaff_RBX = (ulong)uVar2;
    } while (uVar2 != 0);
    pvStack_48 = arg;
    iters = local_34;
    if (-1 < iVar5) goto LAB_00122e19;
    pcStack_40 = (code *)0x122e17;
    bench_ecmult_wnaf_cold_2();
  }
  iVar3 = 0;
LAB_00122e19:
  iVar5 = iters * 0x100;
  if (iVar3 != iVar5 && SBORROW4(iVar3,iVar5) == iVar3 + iters * -0x100 < 0) {
    pcStack_40 = bench_sha256;
    bench_ecmult_wnaf_cold_1();
    if (0 < iVar5) {
      uStack_50 = unaff_RBX;
      pcStack_40 = (code *)unaff_R15;
      do {
        sStack_c0.s[0] = 0x6a09e667;
        sStack_c0.s[1] = 0xbb67ae85;
        sStack_c0.s[2] = 0x3c6ef372;
        sStack_c0.s[3] = 0xa54ff53a;
        sStack_c0.s[4] = 0x510e527f;
        sStack_c0.s[5] = 0x9b05688c;
        sStack_c0.s[6] = 0x1f83d9ab;
        sStack_c0.s[7] = 0x5be0cd19;
        sStack_c0.bytes = 0;
        secp256k1_sha256_write(&sStack_c0,(uchar *)((long)pvVar4 + 0x290),0x20);
        secp256k1_sha256_finalize(&sStack_c0,(uchar *)((long)pvVar4 + 0x290));
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    return;
  }
  return;
}

Assistant:

static void bench_ecmult_wnaf(void* arg, int iters) {
    int i, bits = 0, overflow = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        bits += secp256k1_ecmult_wnaf(data->wnaf, 256, &data->scalar[0], WINDOW_A);
        overflow += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(overflow >= 0);
    CHECK(bits <= 256*iters);
}